

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

char * timestamp_to_string(uint8_t *timestamp,char *string_buf,size_t string_buf_len)

{
  size_t string_buf_len_local;
  char *string_buf_local;
  uint8_t *timestamp_local;
  
  snprintf(string_buf,string_buf_len,"%04d-%02d-%02d %02d:%02d:%02d",(ulong)(*timestamp + 0x76c),
           (ulong)timestamp[1],(ulong)timestamp[2],(uint)timestamp[3],(uint)timestamp[4],
           (uint)timestamp[5]);
  return string_buf;
}

Assistant:

char* timestamp_to_string(uint8_t *timestamp, char *string_buf, size_t string_buf_len) {
    snprintf(string_buf, string_buf_len, "%04d-%02d-%02d %02d:%02d:%02d",
             timestamp[0] + 1900,
             timestamp[1],
             timestamp[2],
             timestamp[3],
             timestamp[4],
             timestamp[5]);

    return string_buf;
}